

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XprHelper.h
# Opt level: O3

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,-1,8,0,-1,8>const,-1,1,false>const>const,1,-1,true>const>const,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,1,0,-1,1>,-1,-1,false>,-1,-1,false>const,-1,1,true>const>>,3,0>
       ::
       run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>const,_1,1,false>const>const,1,_1,true>const>const,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>,_1,_1,false>const,_1,1,true>const>>
                 (redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>_>_>
                  *eval,scalar_sum_op<float,_float> *func,
                 CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>_>
                 *xpr)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  ulong uVar4;
  float *pfVar5;
  float *pfVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  uVar4 = (xpr->m_rhs).
          super_BlockImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
          .
          super_BlockImpl_dense<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_0>
          .m_rows.m_value;
  uVar7 = uVar4 + 7;
  if (-1 < (long)uVar4) {
    uVar7 = uVar4;
  }
  uVar8 = uVar4;
  if (-1 >= (long)uVar4) {
    uVar8 = uVar4 + 3;
  }
  pfVar5 = (eval->
           super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>_>_>
           ).
           super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
           .m_d.lhsImpl.
           super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_1,__1,_true>_>_>
           .
           super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_1,__1,_true>_>,_Eigen::internal::IndexBased,_float>
           .m_argImpl.
           super_evaluator<Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_1,__1,_true>_>
           .
           super_block_evaluator<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_1,__1,_true,_true>
           .
           super_mapbase_evaluator<Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_1,__1,_true>,_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>
           .m_data;
  pfVar6 = (eval->
           super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>_>_>
           ).
           super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
           .m_d.rhsImpl.
           super_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>_>
           .
           super_block_evaluator<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_true>
           .
           super_mapbase_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
           .m_data;
  if (uVar4 + 3 < 7) {
    fVar10 = *pfVar5 * *pfVar6;
    if (1 < (long)uVar4) {
      uVar7 = 1;
      do {
        fVar10 = fVar10 + pfVar5[uVar7] * pfVar6[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
    }
  }
  else {
    uVar8 = uVar8 & 0xfffffffffffffffc;
    fVar10 = *pfVar6 * *pfVar5;
    fVar11 = pfVar6[1] * pfVar5[1];
    fVar12 = pfVar6[2] * pfVar5[2];
    fVar13 = pfVar6[3] * pfVar5[3];
    if (7 < (long)uVar4) {
      uVar7 = uVar7 & 0xfffffffffffffff8;
      fVar14 = pfVar6[4] * pfVar5[4];
      fVar15 = pfVar6[5] * pfVar5[5];
      fVar16 = pfVar6[6] * pfVar5[6];
      fVar17 = pfVar6[7] * pfVar5[7];
      if (0xf < uVar4) {
        lVar9 = 8;
        do {
          pfVar1 = pfVar5 + lVar9;
          pfVar3 = pfVar5 + lVar9 + 4;
          pfVar2 = pfVar6 + lVar9;
          fVar10 = fVar10 + *pfVar2 * *pfVar1;
          fVar11 = fVar11 + pfVar2[1] * pfVar1[1];
          fVar12 = fVar12 + pfVar2[2] * pfVar1[2];
          fVar13 = fVar13 + pfVar2[3] * pfVar1[3];
          pfVar1 = pfVar6 + lVar9 + 4;
          fVar14 = fVar14 + *pfVar1 * *pfVar3;
          fVar15 = fVar15 + pfVar1[1] * pfVar3[1];
          fVar16 = fVar16 + pfVar1[2] * pfVar3[2];
          fVar17 = fVar17 + pfVar1[3] * pfVar3[3];
          lVar9 = lVar9 + 8;
        } while (lVar9 < (long)uVar7);
      }
      fVar10 = fVar14 + fVar10;
      fVar11 = fVar15 + fVar11;
      fVar12 = fVar16 + fVar12;
      fVar13 = fVar17 + fVar13;
      if ((long)uVar7 < (long)uVar8) {
        pfVar1 = pfVar5 + uVar7;
        pfVar2 = pfVar6 + uVar7;
        fVar10 = fVar10 + *pfVar2 * *pfVar1;
        fVar11 = fVar11 + pfVar2[1] * pfVar1[1];
        fVar12 = fVar12 + pfVar2[2] * pfVar1[2];
        fVar13 = fVar13 + pfVar2[3] * pfVar1[3];
      }
    }
    fVar10 = fVar13 + fVar11 + fVar12 + fVar10;
    if ((long)uVar8 < (long)uVar4) {
      do {
        fVar10 = fVar10 + pfVar5[uVar8] * pfVar6[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar4 != uVar8);
    }
  }
  return fVar10;
}

Assistant:

explicit variable_if_dynamic(T value = 0) EIGEN_NO_THROW : m_value(value) {}